

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O1

void Nwk_ManMinimumBaseRec(Nwk_Man_t *pNtk,int fVerbose)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int level;
  Nwk_Man_t *pNVar4;
  timespec ts;
  timespec local_28;
  
  iVar1 = clock_gettime(3,&local_28);
  if (iVar1 < 0) {
    lVar2 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_28.tv_nsec),8);
    lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_28.tv_sec * -1000000;
  }
  do {
    pNVar4 = pNtk;
    iVar1 = Nwk_ManMinimumBaseInt(pNtk,fVerbose);
  } while (iVar1 != 0);
  Abc_Print((int)pNVar4,"%s =","Minbase");
  level = 3;
  iVar1 = clock_gettime(3,&local_28);
  if (iVar1 < 0) {
    lVar3 = -1;
  }
  else {
    lVar3 = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000;
  }
  Abc_Print(level,"%9.2f sec\n",(double)(lVar3 + lVar2) / 1000000.0);
  return;
}

Assistant:

void Nwk_ManMinimumBaseRec( Nwk_Man_t * pNtk, int fVerbose )
{
    int i;
    abctime clk = Abc_Clock();
    for ( i = 0; Nwk_ManMinimumBaseInt( pNtk, fVerbose ); i++ );
    ABC_PRT( "Minbase", Abc_Clock() - clk );
}